

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIDFontWriter.cpp
# Opt level: O1

EStatusCode __thiscall
CIDFontWriter::WriteToUnicodeMap(CIDFontWriter *this,ObjectIDType inToUnicodeMap)

{
  pointer ppVar1;
  undefined1 *puVar2;
  PDFStream *pPVar3;
  EStatusCode EVar4;
  Trace *this_00;
  FreeTypeFaceWrapper *inStreamForWriting;
  ulong inIntegerToken;
  CIDFontWriter *this_01;
  ULongVector *inUnicodeValues;
  pointer ppVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  PrimitiveObjectsWriter primitiveWriter;
  undefined1 auStack_68 [16];
  undefined1 local_58 [32];
  PDFStream *local_38;
  
  this_01 = (CIDFontWriter *)auStack_68;
  EVar4 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inToUnicodeMap);
  if (EVar4 == eSuccess) {
    local_38 = ObjectsContext::StartPDFStream(this->mObjectsContext,(DictionaryContext *)0x0,false);
    inStreamForWriting = (FreeTypeFaceWrapper *)PDFStream::GetWriteStream(local_38);
    PrimitiveObjectsWriter::PrimitiveObjectsWriter
              ((PrimitiveObjectsWriter *)auStack_68,(IByteWriter *)inStreamForWriting);
    ppVar5 = (this->mCharactersVector).
             super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->mCharactersVector).
             super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    auStack_68._8_8_ = inStreamForWriting;
    (*(code *)inStreamForWriting->mFace->face_flags)
              (inStreamForWriting,
               "/CIDInit /ProcSet findresource begin\n12 dict begin\nbegincmap\n/CIDSystemInfo\n<< /Registry (Adobe)\n/Ordering (UCS) /Supplement 0 >> def\n/CMapName /Adobe-Identity-UCS def\n/CMapType 2 def\n1 begincodespacerange\n"
               ,0xce);
    puVar2 = local_58 + 0x10;
    local_58._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_68 + 0x10),"0000","");
    PrimitiveObjectsWriter::WriteEncodedHexString
              ((PrimitiveObjectsWriter *)auStack_68,(string *)(auStack_68 + 0x10),
               eTokenSeparatorSpace);
    if ((undefined1 *)local_58._0_8_ != puVar2) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(uint *)local_58._16_8_ + 1));
    }
    local_58._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_68 + 0x10),"FFFF","");
    PrimitiveObjectsWriter::WriteEncodedHexString
              ((PrimitiveObjectsWriter *)auStack_68,(string *)(auStack_68 + 0x10),
               eTokenSeparatorEndLine);
    if ((undefined1 *)local_58._0_8_ != puVar2) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(uint *)local_58._16_8_ + 1));
    }
    (*(code *)(*(FT_Face *)auStack_68._8_8_)->face_flags)
              (auStack_68._8_8_,"endcodespacerange\n",0x12);
    lVar6 = ((long)ppVar1 - (long)ppVar5 >> 3) * -0x3333333333333333;
    uVar7 = lVar6 - 1;
    uVar8 = 100;
    if (uVar7 < 100) {
      uVar8 = uVar7;
    }
    PrimitiveObjectsWriter::WriteInteger
              ((PrimitiveObjectsWriter *)auStack_68,uVar8,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteKeyword
              ((PrimitiveObjectsWriter *)auStack_68,&scBeginBFChar_abi_cxx11_);
    WriteGlyphEntry(this_01,(IByteWriter *)auStack_68._8_8_,ppVar5[1].second.mEncodedCharacter,
                    &ppVar5[1].second.mUnicodeCharacters);
    if (ppVar5 + 2 !=
        (this->mCharactersVector).
        super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar7 = lVar6 - 2;
      uVar8 = 1;
      lVar6 = -1;
      inUnicodeValues = &ppVar5[2].second.mUnicodeCharacters;
      do {
        if ((uVar8 / 100) * 100 + lVar6 == 0) {
          PrimitiveObjectsWriter::WriteKeyword
                    ((PrimitiveObjectsWriter *)auStack_68,&scEndBFChar_abi_cxx11_);
          inIntegerToken = 100;
          if (uVar7 < 100) {
            inIntegerToken = uVar7;
          }
          PrimitiveObjectsWriter::WriteInteger
                    ((PrimitiveObjectsWriter *)auStack_68,inIntegerToken,eTokenSeparatorSpace);
          this_01 = (CIDFontWriter *)auStack_68;
          PrimitiveObjectsWriter::WriteKeyword
                    ((PrimitiveObjectsWriter *)auStack_68,&scBeginBFChar_abi_cxx11_);
        }
        WriteGlyphEntry(this_01,(IByteWriter *)auStack_68._8_8_,
                        *(unsigned_short *)((long)(inUnicodeValues + -1) + 0x10),inUnicodeValues);
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + -1;
        uVar7 = uVar7 - 1;
        ppVar5 = (pointer)(inUnicodeValues + 1);
        inUnicodeValues = (ULongVector *)((long)(inUnicodeValues + 1) + 0x10);
      } while (ppVar5 != (this->mCharactersVector).
                         super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    PrimitiveObjectsWriter::WriteKeyword
              ((PrimitiveObjectsWriter *)auStack_68,&scEndBFChar_abi_cxx11_);
    (*(code *)(*(FT_Face *)auStack_68._8_8_)->face_flags)
              (auStack_68._8_8_,"endcmap CMapName currentdict /CMap defineresource pop end end\n",
               0x3e);
    EVar4 = ObjectsContext::EndPDFStream(this->mObjectsContext,local_38);
    pPVar3 = local_38;
    PDFStream::~PDFStream(local_38);
    operator_delete(pPVar3,0xf0);
    PrimitiveObjectsWriter::~PrimitiveObjectsWriter((PrimitiveObjectsWriter *)auStack_68);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "CIDFontWriter::WriteToUnicodeMap, could not write to unicode map object %ld",
                      inToUnicodeMap);
  }
  return EVar4;
}

Assistant:

EStatusCode CIDFontWriter::WriteToUnicodeMap(ObjectIDType inToUnicodeMap)
{
	EStatusCode status = mObjectsContext->StartNewIndirectObject(inToUnicodeMap);
	if(status != eSuccess)
	{
		TRACE_LOG1("CIDFontWriter::WriteToUnicodeMap, could not write to unicode map object %ld",inToUnicodeMap);
		return status;
	}
	PDFStream* pdfStream = mObjectsContext->StartPDFStream();
	IByteWriter* cmapWriteContext = pdfStream->GetWriteStream();
	PrimitiveObjectsWriter primitiveWriter(cmapWriteContext);
	unsigned long i = 1;
	UIntAndGlyphEncodingInfoVector::iterator it = mCharactersVector.begin() + 1; // skip 0 glyph
	unsigned long vectorSize = (unsigned long)mCharactersVector.size() - 1; // cause 0 is not there

	cmapWriteContext->Write((const Byte*)scCmapHeader,strlen(scCmapHeader));
	primitiveWriter.WriteEncodedHexString(scFourByteRangeStart);
	primitiveWriter.WriteEncodedHexString(scFourByteRangeEnd,eTokenSeparatorEndLine);
	cmapWriteContext->Write((const Byte*)scEndCodeSpaceRange,strlen(scEndCodeSpaceRange));

	if(vectorSize < 100)
		primitiveWriter.WriteInteger(vectorSize);
	else
		primitiveWriter.WriteInteger(100);
	primitiveWriter.WriteKeyword(scBeginBFChar);
	
	WriteGlyphEntry(cmapWriteContext,it->second.mEncodedCharacter,it->second.mUnicodeCharacters);
	++it;
	for(; it != mCharactersVector.end(); ++it,++i)
	{
		if(i % 100 == 0)
		{
			primitiveWriter.WriteKeyword(scEndBFChar);
			if(vectorSize - i < 100)
				primitiveWriter.WriteInteger(vectorSize - i);
			else
				primitiveWriter.WriteInteger(100);
			primitiveWriter.WriteKeyword(scBeginBFChar);
		}
		WriteGlyphEntry(cmapWriteContext,it->second.mEncodedCharacter,it->second.mUnicodeCharacters);
	}
	primitiveWriter.WriteKeyword(scEndBFChar);
	cmapWriteContext->Write((const Byte*)scCmapFooter,strlen(scCmapFooter));
	status = mObjectsContext->EndPDFStream(pdfStream);
	delete pdfStream;
	return status;
}